

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O1

int set_file_comment(char **argv)

{
  char *__s;
  zip_t *pzVar1;
  int iVar2;
  ulonglong uVar3;
  size_t sVar4;
  int iVar5;
  
  iVar5 = 0;
  uVar3 = strtoull(*argv,(char **)0x0,10);
  pzVar1 = za;
  __s = argv[1];
  sVar4 = strlen(__s);
  iVar2 = zip_file_set_comment(pzVar1,uVar3,__s,sVar4 & 0xffff,0);
  if (iVar2 < 0) {
    set_file_comment_cold_1();
    iVar5 = -1;
  }
  return iVar5;
}

Assistant:

static int
set_file_comment(char *argv[]) {
    zip_uint64_t idx;
    idx = strtoull(argv[0], NULL, 10);
    if (zip_file_set_comment(za, idx, argv[1], (zip_uint16_t)strlen(argv[1]), 0) < 0) {
        fprintf(stderr, "can't set file comment at index '%" PRIu64 "' to '%s': %s\n", idx, argv[1], zip_strerror(za));
        return -1;
    }
    return 0;
}